

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_hook_add(uc_engine *uc,uc_hook *hh,int type,void *callback,void *user_data,uint64_t begin,
                  uint64_t end,...)

{
  char in_AL;
  _Bool _Var1;
  hook *h;
  GHashTable *pGVar2;
  void *pvVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined1 local_148 [48];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined4 local_98;
  undefined4 local_94;
  va_list valist_1;
  va_list valist;
  hook *hook;
  int local_48;
  int __init_ret;
  int i;
  int ret;
  uint64_t begin_local;
  void *user_data_local;
  void *callback_local;
  int type_local;
  uc_hook *hh_local;
  uc_engine *uc_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  local_48 = 0;
  if ((((uc->init_done ^ 0xffU) & 1) == 0) ||
     (uc_local._4_4_ = uc_init_engine(uc), uc_local._4_4_ == UC_ERR_OK)) {
    h = (hook *)calloc(1,0x40);
    if (h == (hook *)0x0) {
      uc_local._4_4_ = UC_ERR_NOMEM;
    }
    else {
      h->begin = begin;
      h->end = end;
      h->type = type;
      h->callback = callback;
      h->user_data = user_data;
      h->refs = 0;
      h->to_delete = false;
      pGVar2 = g_hash_table_new_full
                         (hooked_regions_hash,hooked_regions_equal,g_free,(GDestroyNotify)0x0);
      h->hooked_regions = pGVar2;
      *hh = (uc_hook)h;
      if ((type & 2U) == 0) {
        if ((type & 0x10000U) == 0) {
          for (; 0 < type >> ((byte)local_48 & 0x1f); local_48 = local_48 + 1) {
            if (((type >> ((byte)local_48 & 0x1f) & 1U) != 0) && (local_48 < 0x12)) {
              if ((uc->hook_insert & 1U) == 0) {
                pvVar3 = hook_append(uc->hook + local_48,h);
                if (pvVar3 == (void *)0x0) {
                  free(h);
                  return UC_ERR_NOMEM;
                }
              }
              else {
                pvVar3 = hook_insert(uc->hook + local_48,h);
                if (pvVar3 == (void *)0x0) {
                  free(h);
                  return UC_ERR_NOMEM;
                }
              }
              uc->hooks_count[local_48] = uc->hooks_count[local_48] + 1;
            }
          }
          if (h->refs == 0) {
            free(h);
          }
          uc_local._4_4_ = UC_ERR_OK;
        }
        else {
          valist_1[0].overflow_arg_area = local_148;
          local_94 = 0x30;
          h->op = in_stack_00000010;
          valist_1[0]._0_8_ = &stack0x00000020;
          local_98 = 0x30;
          h->op_flags = in_stack_00000018;
          if ((uc->opcode_hook_invalidate == (uc_opcode_hook_validate_t)0x0) ||
             (_Var1 = (*uc->opcode_hook_invalidate)(h->op,h->op_flags), _Var1)) {
            if ((uc->hook_insert & 1U) == 0) {
              pvVar3 = hook_append(uc->hook + 0x10,h);
              if (pvVar3 == (void *)0x0) {
                free(h);
                return UC_ERR_NOMEM;
              }
            }
            else {
              pvVar3 = hook_insert(uc->hook + 0x10,h);
              if (pvVar3 == (void *)0x0) {
                free(h);
                return UC_ERR_NOMEM;
              }
            }
            uc->hooks_count[0x10] = uc->hooks_count[0x10] + 1;
            uc_local._4_4_ = UC_ERR_OK;
          }
          else {
            free(h);
            uc_local._4_4_ = UC_ERR_HOOK;
          }
        }
      }
      else {
        h->insn = in_stack_00000010;
        if ((uc->insn_hook_validate == (uc_insn_hook_validate)0x0) ||
           (_Var1 = (*uc->insn_hook_validate)(h->insn), _Var1)) {
          if ((uc->hook_insert & 1U) == 0) {
            pvVar3 = hook_append(uc->hook + 1,h);
            if (pvVar3 == (void *)0x0) {
              free(h);
              return UC_ERR_NOMEM;
            }
          }
          else {
            pvVar3 = hook_insert(uc->hook + 1,h);
            if (pvVar3 == (void *)0x0) {
              free(h);
              return UC_ERR_NOMEM;
            }
          }
          uc->hooks_count[1] = uc->hooks_count[1] + 1;
          uc_local._4_4_ = UC_ERR_OK;
        }
        else {
          free(h);
          uc_local._4_4_ = UC_ERR_HOOK;
        }
      }
    }
  }
  return uc_local._4_4_;
}

Assistant:

UNICORN_EXPORT
uc_err uc_hook_add(uc_engine *uc, uc_hook *hh, int type, void *callback,
                   void *user_data, uint64_t begin, uint64_t end, ...)
{
    int ret = UC_ERR_OK;
    int i = 0;

    UC_INIT(uc);

    struct hook *hook = calloc(1, sizeof(struct hook));
    if (hook == NULL) {
        return UC_ERR_NOMEM;
    }

    hook->begin = begin;
    hook->end = end;
    hook->type = type;
    hook->callback = callback;
    hook->user_data = user_data;
    hook->refs = 0;
    hook->to_delete = false;
    hook->hooked_regions = g_hash_table_new_full(
        hooked_regions_hash, hooked_regions_equal, g_free, NULL);
    *hh = (uc_hook)hook;

    // UC_HOOK_INSN has an extra argument for instruction ID
    if (type & UC_HOOK_INSN) {
        va_list valist;

        va_start(valist, end);
        hook->insn = va_arg(valist, int);
        va_end(valist);

        if (uc->insn_hook_validate) {
            if (!uc->insn_hook_validate(hook->insn)) {
                free(hook);
                return UC_ERR_HOOK;
            }
        }

        if (uc->hook_insert) {
            if (hook_insert(&uc->hook[UC_HOOK_INSN_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        } else {
            if (hook_append(&uc->hook[UC_HOOK_INSN_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        }

        uc->hooks_count[UC_HOOK_INSN_IDX]++;
        return UC_ERR_OK;
    }

    if (type & UC_HOOK_TCG_OPCODE) {
        va_list valist;

        va_start(valist, end);
        hook->op = va_arg(valist, int);
        hook->op_flags = va_arg(valist, int);
        va_end(valist);

        if (uc->opcode_hook_invalidate) {
            if (!uc->opcode_hook_invalidate(hook->op, hook->op_flags)) {
                free(hook);
                return UC_ERR_HOOK;
            }
        }

        if (uc->hook_insert) {
            if (hook_insert(&uc->hook[UC_HOOK_TCG_OPCODE_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        } else {
            if (hook_append(&uc->hook[UC_HOOK_TCG_OPCODE_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        }

        uc->hooks_count[UC_HOOK_TCG_OPCODE_IDX]++;
        return UC_ERR_OK;
    }

    while ((type >> i) > 0) {
        if ((type >> i) & 1) {
            // TODO: invalid hook error?
            if (i < UC_HOOK_MAX) {
                if (uc->hook_insert) {
                    if (hook_insert(&uc->hook[i], hook) == NULL) {
                        free(hook);
                        return UC_ERR_NOMEM;
                    }
                } else {
                    if (hook_append(&uc->hook[i], hook) == NULL) {
                        free(hook);
                        return UC_ERR_NOMEM;
                    }
                }
                uc->hooks_count[i]++;
            }
        }
        i++;
    }

    // we didn't use the hook
    // TODO: return an error?
    if (hook->refs == 0) {
        free(hook);
    }

    return ret;
}